

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O2

void Cec2_ManSaveCis(Gia_Man_t *p)

{
  Vec_Wrd_t *pVVar1;
  word wVar2;
  int iVar3;
  Gia_Obj_t *pObj;
  word *pwVar4;
  int v;
  long lVar5;
  uint uVar6;
  
  if (p->vSimsPi == (Vec_Wrd_t *)0x0) {
    __assert_fail("p->vSimsPi != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                  ,0x1fa,"void Cec2_ManSaveCis(Gia_Man_t *)");
  }
  lVar5 = 0;
  do {
    if (p->nSimWords <= lVar5) {
      return;
    }
    for (v = 0; v < p->vCis->nSize; v = v + 1) {
      pObj = Gia_ManCi(p,v);
      iVar3 = Gia_ObjId(p,pObj);
      if (iVar3 == 0) break;
      pVVar1 = p->vSimsPi;
      pwVar4 = Cec2_ObjSim(p,iVar3);
      wVar2 = pwVar4[lVar5];
      iVar3 = pVVar1->nSize;
      if (iVar3 == pVVar1->nCap) {
        uVar6 = iVar3 * 2;
        if (iVar3 < 0x10) {
          uVar6 = 0x10;
        }
        if (iVar3 < (int)uVar6) {
          if (pVVar1->pArray == (word *)0x0) {
            pwVar4 = (word *)malloc((ulong)uVar6 << 3);
          }
          else {
            pwVar4 = (word *)realloc(pVVar1->pArray,(ulong)uVar6 << 3);
          }
          pVVar1->pArray = pwVar4;
          if (pwVar4 == (word *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
          }
          pVVar1->nCap = uVar6;
          iVar3 = pVVar1->nSize;
        }
      }
      pVVar1->nSize = iVar3 + 1;
      pVVar1->pArray[iVar3] = wVar2;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void Cec2_ManSaveCis( Gia_Man_t * p )
{
    int w, i, Id;
    assert( p->vSimsPi != NULL );
    for ( w = 0; w < p->nSimWords; w++ )
        Gia_ManForEachCiId( p, Id, i )
            Vec_WrdPush( p->vSimsPi, Cec2_ObjSim(p, Id)[w] );
}